

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

int AF_A_WeaponReady(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *self;
  uint uVar3;
  uint paramflags;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004c6e92;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_004c6d5a:
        self = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004c6e92;
        }
      }
      uVar3 = 0;
      paramflags = 0;
      if (numparam == 1) goto LAB_004c6e1b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_004c6e82;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_004c6e92;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_004c6e82;
      }
      paramflags = uVar3;
      if ((uint)numparam < 3) {
LAB_004c6e1b:
        DoReadyWeaponToSwitch(self,(paramflags & 2) == 0);
        if ((~paramflags & 0xc) != 0) {
          DoReadyWeaponToFire(self,(paramflags & 4) == 0,(paramflags & 8) == 0);
        }
        if ((paramflags & 1) == 0) {
          DoReadyWeaponToBob(self);
        }
        DoReadyWeaponToGeneric(self,paramflags);
        DoReadyWeaponDisableSwitch(self,paramflags & 0x40);
        return 0;
      }
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 == 0xff) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
        if (numparam != 3) {
          VVar1 = param[3].field_0.field_3.Type;
          if (VVar1 == '\0') {
            paramflags = param[3].field_0.i;
          }
          else if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x2e8,
                          "int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
        goto LAB_004c6e1b;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_004c6e92;
    }
    if (self == (AActor *)0x0) goto LAB_004c6d5a;
  }
LAB_004c6e82:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004c6e92:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x2e7,"int AF_A_WeaponReady(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AInventory, A_WeaponReady)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(flags)	{ flags = 0; }

													DoReadyWeaponToSwitch(self, !(flags & WRF_NoSwitch));
	if ((flags & WRF_NoFire) != WRF_NoFire)			DoReadyWeaponToFire(self, !(flags & WRF_NoPrimary), !(flags & WRF_NoSecondary));
	if (!(flags & WRF_NoBob))						DoReadyWeaponToBob(self);
													DoReadyWeaponToGeneric(self, flags);
	DoReadyWeaponDisableSwitch(self, flags & WRF_DisableSwitch);
	return 0;
}